

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void xmlCtxtReset(xmlParserCtxtPtr ctxt)

{
  uint uVar1;
  xmlDictPtr dict;
  xmlParserInputPtr *ppxVar2;
  int *piVar3;
  int iVar4;
  xmlParserInputPtr pxVar5;
  uint uVar6;
  xmlChar *pxVar7;
  
  if (ctxt == (xmlParserCtxtPtr)0x0) {
    return;
  }
  dict = ctxt->dict;
  while (uVar1 = ctxt->inputNr, 0 < (int)uVar1) {
    uVar6 = uVar1 - 1;
    ctxt->inputNr = uVar6;
    ppxVar2 = ctxt->inputTab;
    if (uVar1 == 1) {
      pxVar5 = (xmlParserInputPtr)0x0;
    }
    else {
      pxVar5 = ppxVar2[(ulong)uVar1 - 2];
    }
    ctxt->input = pxVar5;
    pxVar5 = ppxVar2[uVar6];
    ppxVar2[uVar6] = (xmlParserInputPtr)0x0;
    if (pxVar5 == (xmlParserInputPtr)0x0) break;
    xmlFreeInputStream(pxVar5);
  }
  ctxt->inputNr = 0;
  ctxt->input = (xmlParserInputPtr)0x0;
  ctxt->spaceNr = 0;
  piVar3 = ctxt->spaceTab;
  if (piVar3 != (int *)0x0) {
    *piVar3 = -1;
  }
  ctxt->space = piVar3;
  ctxt->nodeNr = 0;
  ctxt->node = (xmlNodePtr)0x0;
  ctxt->nameNr = 0;
  ctxt->name = (xmlChar *)0x0;
  pxVar7 = ctxt->version;
  if (pxVar7 != (xmlChar *)0x0) {
    if (dict != (xmlDictPtr)0x0) {
      iVar4 = xmlDictOwns(dict,pxVar7);
      if (iVar4 != 0) goto LAB_0016b78d;
      pxVar7 = ctxt->version;
    }
    (*xmlFree)(pxVar7);
  }
LAB_0016b78d:
  ctxt->version = (xmlChar *)0x0;
  pxVar7 = ctxt->encoding;
  if (pxVar7 != (xmlChar *)0x0) {
    if (dict != (xmlDictPtr)0x0) {
      iVar4 = xmlDictOwns(dict,pxVar7);
      if (iVar4 != 0) goto LAB_0016b7bf;
      pxVar7 = ctxt->encoding;
    }
    (*xmlFree)(pxVar7);
  }
LAB_0016b7bf:
  ctxt->encoding = (xmlChar *)0x0;
  pxVar7 = (xmlChar *)ctxt->directory;
  if (pxVar7 != (xmlChar *)0x0) {
    if (dict != (xmlDictPtr)0x0) {
      iVar4 = xmlDictOwns(dict,pxVar7);
      if (iVar4 != 0) goto LAB_0016b7f7;
      pxVar7 = (xmlChar *)ctxt->directory;
    }
    (*xmlFree)(pxVar7);
  }
LAB_0016b7f7:
  ctxt->directory = (char *)0x0;
  pxVar7 = ctxt->extSubURI;
  if (pxVar7 != (xmlChar *)0x0) {
    if (dict != (xmlDictPtr)0x0) {
      iVar4 = xmlDictOwns(dict,pxVar7);
      if (iVar4 != 0) goto LAB_0016b832;
      pxVar7 = ctxt->extSubURI;
    }
    (*xmlFree)(pxVar7);
  }
LAB_0016b832:
  ctxt->extSubURI = (xmlChar *)0x0;
  pxVar7 = ctxt->extSubSystem;
  if (pxVar7 != (xmlChar *)0x0) {
    if (dict != (xmlDictPtr)0x0) {
      iVar4 = xmlDictOwns(dict,pxVar7);
      if (iVar4 != 0) goto LAB_0016b86d;
      pxVar7 = ctxt->extSubSystem;
    }
    (*xmlFree)(pxVar7);
  }
LAB_0016b86d:
  ctxt->extSubSystem = (xmlChar *)0x0;
  if (ctxt->myDoc != (xmlDocPtr)0x0) {
    xmlFreeDoc(ctxt->myDoc);
  }
  ctxt->myDoc = (xmlDocPtr)0x0;
  ctxt->standalone = -1;
  ctxt->html = 0;
  ctxt->instate = XML_PARSER_START;
  ctxt->token = 0;
  ctxt->wellFormed = 1;
  ctxt->nsWellFormed = 1;
  ctxt->disableSAX = 0;
  ctxt->inSubset = 0;
  ctxt->hasExternalSubset = 0;
  ctxt->hasPErefs = 0;
  ctxt->external = 0;
  ctxt->valid = 1;
  ctxt->record_info = 0;
  ctxt->checkIndex = 0;
  ctxt->errNo = 0;
  ctxt->depth = 0;
  ctxt->charset = 1;
  ctxt->catalogs = (void *)0x0;
  ctxt->nbentities = 0;
  ctxt->sizeentities = 0;
  ctxt->sizeentcopy = 0;
  ctxt->mlType = XML_TYPE_UNKNOWN;
  ctxt->curly = 0;
  xmlInitNodeInfoSeq(&ctxt->node_seq);
  if (ctxt->attsDefault != (xmlHashTablePtr)0x0) {
    xmlHashFree(ctxt->attsDefault,xmlHashDefaultDeallocator);
    ctxt->attsDefault = (xmlHashTablePtr)0x0;
  }
  if (ctxt->attsSpecial != (xmlHashTablePtr)0x0) {
    xmlHashFree(ctxt->attsSpecial,(xmlHashDeallocator)0x0);
    ctxt->attsSpecial = (xmlHashTablePtr)0x0;
  }
  if (ctxt->catalogs != (void *)0x0) {
    xmlCatalogFreeLocal(ctxt->catalogs);
  }
  if ((ctxt->lastError).code == 0) {
    return;
  }
  xmlResetError(&ctxt->lastError);
  return;
}

Assistant:

void
xmlCtxtReset(xmlParserCtxtPtr ctxt)
{
    xmlParserInputPtr input;
    xmlDictPtr dict;

    if (ctxt == NULL)
        return;

    dict = ctxt->dict;

    while ((input = inputPop(ctxt)) != NULL) { /* Non consuming */
        xmlFreeInputStream(input);
    }
    ctxt->inputNr = 0;
    ctxt->input = NULL;

    ctxt->spaceNr = 0;
    if (ctxt->spaceTab != NULL) {
	ctxt->spaceTab[0] = -1;
	ctxt->space = &ctxt->spaceTab[0];
    } else {
        ctxt->space = NULL;
    }


    ctxt->nodeNr = 0;
    ctxt->node = NULL;

    ctxt->nameNr = 0;
    ctxt->name = NULL;

    DICT_FREE(ctxt->version);
    ctxt->version = NULL;
    DICT_FREE(ctxt->encoding);
    ctxt->encoding = NULL;
    DICT_FREE(ctxt->directory);
    ctxt->directory = NULL;
    DICT_FREE(ctxt->extSubURI);
    ctxt->extSubURI = NULL;
    DICT_FREE(ctxt->extSubSystem);
    ctxt->extSubSystem = NULL;
    if (ctxt->myDoc != NULL)
        xmlFreeDoc(ctxt->myDoc);
    ctxt->myDoc = NULL;

    ctxt->standalone = -1;
    ctxt->hasExternalSubset = 0;
    ctxt->hasPErefs = 0;
    ctxt->html = 0;
    ctxt->external = 0;
    ctxt->instate = XML_PARSER_START;
    ctxt->token = 0;

    ctxt->wellFormed = 1;
    ctxt->nsWellFormed = 1;
    ctxt->disableSAX = 0;
    ctxt->valid = 1;
#if 0
    ctxt->vctxt.userData = ctxt;
    ctxt->vctxt.error = xmlParserValidityError;
    ctxt->vctxt.warning = xmlParserValidityWarning;
#endif
    ctxt->record_info = 0;
    ctxt->checkIndex = 0;
    ctxt->inSubset = 0;
    ctxt->errNo = XML_ERR_OK;
    ctxt->depth = 0;
    ctxt->charset = XML_CHAR_ENCODING_UTF8;
    ctxt->catalogs = NULL;
    ctxt->nbentities = 0;
    ctxt->sizeentities = 0;
    ctxt->sizeentcopy = 0;
    ctxt->mlType = 0;
    ctxt->curly = 0;
    xmlInitNodeInfoSeq(&ctxt->node_seq);

    if (ctxt->attsDefault != NULL) {
        xmlHashFree(ctxt->attsDefault, xmlHashDefaultDeallocator);
        ctxt->attsDefault = NULL;
    }
    if (ctxt->attsSpecial != NULL) {
        xmlHashFree(ctxt->attsSpecial, NULL);
        ctxt->attsSpecial = NULL;
    }

#ifdef LIBXML_CATALOG_ENABLED
    if (ctxt->catalogs != NULL)
	xmlCatalogFreeLocal(ctxt->catalogs);
#endif
    if (ctxt->lastError.code != XML_ERR_OK)
        xmlResetError(&ctxt->lastError);
}